

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagHelperMethodWrapper.cpp
# Opt level: O2

Var Js::HelperMethodWrapper7
              (ScriptContext *scriptContext,void *origHelperAddr,Var arg1,Var arg2,Var arg3,Var arg4
              ,Var arg5,Var arg6,Var arg7)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Var pvVar4;
  anon_class_64_8_7e0896df local_c8;
  anon_class_64_8_7e0896df local_88;
  Var local_48;
  ScriptContext *local_40;
  AutoRegisterIgnoreExceptionWrapper local_38;
  
  if (origHelperAddr == (void *)0x0) {
    AssertCount = AssertCount + 1;
    local_48 = arg4;
    local_40 = scriptContext;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagHelperMethodWrapper.cpp"
                                ,0x82,"(origHelperAddr)","origHelperAddr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    arg4 = local_48;
    scriptContext = local_40;
  }
  local_88.arg5 = arg5;
  local_88.arg6 = arg6;
  local_88.arg7 = arg7;
  local_88.origHelperAddr = origHelperAddr;
  local_88.arg1 = arg1;
  local_88.arg2 = arg2;
  local_88.arg3 = arg3;
  local_88.arg4 = arg4;
  bVar2 = AutoRegisterIgnoreExceptionWrapper::IsRegistered(scriptContext->threadContext);
  if (bVar2) {
    pvVar4 = HelperMethodWrapper7::anon_class_64_8_7e0896df::operator()(&local_88);
  }
  else {
    AutoRegisterIgnoreExceptionWrapper::AutoRegisterIgnoreExceptionWrapper
              (&local_38,scriptContext->threadContext);
    local_c8.arg6 = local_88.arg6;
    local_c8.arg7 = local_88.arg7;
    local_c8.arg4 = local_88.arg4;
    local_c8.arg5 = local_88.arg5;
    local_c8.arg2 = local_88.arg2;
    local_c8.arg3 = local_88.arg3;
    local_c8.origHelperAddr = local_88.origHelperAddr;
    local_c8.arg1 = local_88.arg1;
    pvVar4 = HelperMethodWrapper7::anon_class_64_8_7e0896df::operator()(&local_c8);
    AutoRegisterIgnoreExceptionWrapper::~AutoRegisterIgnoreExceptionWrapper(&local_38);
  }
  return pvVar4;
}

Assistant:

Var HelperMethodWrapper7(ScriptContext* scriptContext, void* origHelperAddr, Var arg1, Var arg2, Var arg3, Var arg4, Var arg5, Var arg6, Var arg7)
    {
        Assert(origHelperAddr);
        return HelperMethodWrapper(scriptContext, [=] {
            return ((OrigHelperMethod7)origHelperAddr)(arg1, arg2, arg3, arg4, arg5, arg6, arg7);
        });
    }